

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# srv_state.hxx
# Opt level: O3

void __thiscall nuraft::srv_state::inc_term(srv_state *this)

{
  long lVar1;
  uint __val;
  long lVar2;
  uint uVar3;
  unsigned_long uVar4;
  long *plVar5;
  uint uVar6;
  long *plVar7;
  char *pcVar8;
  ulong uVar9;
  uint in_ESI;
  char *pcVar10;
  srv_state *psVar11;
  uint __len;
  long *plStack_88;
  long lStack_80;
  long lStack_78;
  long lStack_70;
  undefined1 *apuStack_68 [2];
  undefined1 auStack_58 [16];
  srv_state *psStack_48;
  __atomic_base<unsigned_long> local_10;
  
  if ((this->inc_term_cb_).super__Function_base._M_manager == (_Manager_type)0x0) {
    LOCK();
    (this->term_).super___atomic_base<unsigned_long>._M_i =
         (this->term_).super___atomic_base<unsigned_long>._M_i + 1;
    UNLOCK();
    return;
  }
  local_10._M_i = (this->term_).super___atomic_base<unsigned_long>._M_i;
  if ((this->inc_term_cb_).super__Function_base._M_manager != (_Manager_type)0x0) {
    uVar4 = (*(this->inc_term_cb_)._M_invoker)((_Any_data *)&this->inc_term_cb_,&local_10._M_i);
    LOCK();
    (this->term_).super___atomic_base<unsigned_long>._M_i = uVar4;
    UNLOCK();
    return;
  }
  psVar11 = this;
  std::__throw_bad_function_call();
  psStack_48 = this;
  switch(in_ESI) {
  case 1:
    *(atomic<int> **)psVar11 = &psVar11->voted_for_;
    pcVar10 = "request_vote_request";
    pcVar8 = "";
    break;
  case 2:
    *(atomic<int> **)psVar11 = &psVar11->voted_for_;
    pcVar10 = "request_vote_response";
    pcVar8 = "";
    break;
  case 3:
    *(atomic<int> **)psVar11 = &psVar11->voted_for_;
    pcVar10 = "append_entries_request";
    pcVar8 = "";
    break;
  case 4:
    *(atomic<int> **)psVar11 = &psVar11->voted_for_;
    pcVar10 = "append_entries_response";
    pcVar8 = "";
    break;
  case 5:
    *(atomic<int> **)psVar11 = &psVar11->voted_for_;
    pcVar10 = "client_request";
    pcVar8 = "";
    break;
  case 6:
    *(atomic<int> **)psVar11 = &psVar11->voted_for_;
    pcVar10 = "add_server_request";
    pcVar8 = "";
    break;
  case 7:
    *(atomic<int> **)psVar11 = &psVar11->voted_for_;
    pcVar10 = "add_server_response";
    pcVar8 = "";
    break;
  case 8:
    *(atomic<int> **)psVar11 = &psVar11->voted_for_;
    pcVar10 = "remove_server_request";
    pcVar8 = "";
    break;
  case 9:
    *(atomic<int> **)psVar11 = &psVar11->voted_for_;
    pcVar10 = "remove_server_response";
    pcVar8 = "";
    break;
  case 10:
    *(atomic<int> **)psVar11 = &psVar11->voted_for_;
    pcVar10 = "sync_log_request";
    pcVar8 = "";
    break;
  case 0xb:
    *(atomic<int> **)psVar11 = &psVar11->voted_for_;
    pcVar10 = "sync_log_response";
    pcVar8 = "";
    break;
  case 0xc:
    *(atomic<int> **)psVar11 = &psVar11->voted_for_;
    pcVar10 = "join_cluster_request";
    pcVar8 = "";
    break;
  case 0xd:
    *(atomic<int> **)psVar11 = &psVar11->voted_for_;
    pcVar10 = "join_cluster_response";
    pcVar8 = "";
    break;
  case 0xe:
    *(atomic<int> **)psVar11 = &psVar11->voted_for_;
    pcVar10 = "leave_cluster_request";
    pcVar8 = "";
    break;
  case 0xf:
    *(atomic<int> **)psVar11 = &psVar11->voted_for_;
    pcVar10 = "leave_cluster_response";
    pcVar8 = "";
    break;
  case 0x10:
    *(atomic<int> **)psVar11 = &psVar11->voted_for_;
    pcVar10 = "install_snapshot_request";
    pcVar8 = "";
    break;
  case 0x11:
    *(atomic<int> **)psVar11 = &psVar11->voted_for_;
    pcVar10 = "install_snapshot_response";
    pcVar8 = "";
    break;
  case 0x12:
    *(atomic<int> **)psVar11 = &psVar11->voted_for_;
    pcVar10 = "ping_request";
    pcVar8 = "";
    break;
  case 0x13:
    *(atomic<int> **)psVar11 = &psVar11->voted_for_;
    pcVar10 = "ping_response";
    pcVar8 = "";
    break;
  case 0x14:
    *(atomic<int> **)psVar11 = &psVar11->voted_for_;
    pcVar10 = "pre_vote_request";
    pcVar8 = "";
    break;
  case 0x15:
    *(atomic<int> **)psVar11 = &psVar11->voted_for_;
    pcVar10 = "pre_vote_response";
    pcVar8 = "";
    break;
  case 0x16:
    *(atomic<int> **)psVar11 = &psVar11->voted_for_;
    pcVar10 = "other_request";
    pcVar8 = "";
    break;
  case 0x17:
    *(atomic<int> **)psVar11 = &psVar11->voted_for_;
    pcVar10 = "other_response";
    pcVar8 = "";
    break;
  case 0x18:
    *(atomic<int> **)psVar11 = &psVar11->voted_for_;
    pcVar10 = "priority_change_request";
    pcVar8 = "";
    break;
  case 0x19:
    *(atomic<int> **)psVar11 = &psVar11->voted_for_;
    pcVar10 = "priority_change_response";
    pcVar8 = "";
    break;
  case 0x1a:
    *(atomic<int> **)psVar11 = &psVar11->voted_for_;
    pcVar10 = "reconnect_request";
    pcVar8 = "";
    break;
  case 0x1b:
    *(atomic<int> **)psVar11 = &psVar11->voted_for_;
    pcVar10 = "reconnect_response";
    pcVar8 = "";
    break;
  case 0x1c:
    *(atomic<int> **)psVar11 = &psVar11->voted_for_;
    pcVar10 = "custom_notification_request";
    pcVar8 = "";
    break;
  case 0x1d:
    *(atomic<int> **)psVar11 = &psVar11->voted_for_;
    pcVar10 = "custom_notification_response";
    pcVar8 = "";
    break;
  default:
    __val = -in_ESI;
    if (0 < (int)in_ESI) {
      __val = in_ESI;
    }
    __len = 1;
    if (9 < __val) {
      uVar9 = (ulong)__val;
      uVar3 = 4;
      do {
        __len = uVar3;
        uVar6 = (uint)uVar9;
        if (uVar6 < 100) {
          __len = __len - 2;
          goto LAB_001efd3b;
        }
        if (uVar6 < 1000) {
          __len = __len - 1;
          goto LAB_001efd3b;
        }
        if (uVar6 < 10000) goto LAB_001efd3b;
        uVar9 = uVar9 / 10000;
        uVar3 = __len + 4;
      } while (99999 < uVar6);
      __len = __len + 1;
    }
LAB_001efd3b:
    apuStack_68[0] = auStack_58;
    std::__cxx11::string::_M_construct((ulong)apuStack_68,(char)__len - (char)((int)in_ESI >> 0x1f))
    ;
    std::__detail::__to_chars_10_impl<unsigned_int>(apuStack_68[0] + (in_ESI >> 0x1f),__len,__val);
    plVar5 = (long *)std::__cxx11::string::replace((ulong)apuStack_68,0,(char *)0x0,0x20a67f);
    plVar7 = plVar5 + 2;
    if ((long *)*plVar5 == plVar7) {
      lStack_78 = *plVar7;
      lStack_70 = plVar5[3];
      plStack_88 = &lStack_78;
    }
    else {
      lStack_78 = *plVar7;
      plStack_88 = (long *)*plVar5;
    }
    lStack_80 = plVar5[1];
    *plVar5 = (long)plVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&plStack_88);
    *(atomic<int> **)psVar11 = &psVar11->voted_for_;
    plVar7 = plVar5 + 2;
    if ((long *)*plVar5 == plVar7) {
      lVar1 = *plVar7;
      lVar2 = plVar5[3];
      psVar11->voted_for_ = (atomic<int>)(int)lVar1;
      psVar11->election_timer_allowed_ = (atomic<bool>)(char)((ulong)lVar1 >> 0x20);
      *(int3 *)&psVar11->field_0x15 = (int3)((ulong)lVar1 >> 0x28);
      *(long *)&(psVar11->inc_term_cb_).super__Function_base._M_functor = lVar2;
    }
    else {
      *(long **)psVar11 = (long *)*plVar5;
      lVar1 = *plVar7;
      psVar11->voted_for_ = (atomic<int>)(int)lVar1;
      psVar11->election_timer_allowed_ = (atomic<bool>)(char)((ulong)lVar1 >> 0x20);
      *(int3 *)&psVar11->field_0x15 = (int3)((ulong)lVar1 >> 0x28);
    }
    (psVar11->term_).super___atomic_base<unsigned_long>._M_i = plVar5[1];
    *plVar5 = (long)plVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    if (plStack_88 != &lStack_78) {
      operator_delete(plStack_88);
    }
    if (apuStack_68[0] == auStack_58) {
      return;
    }
    operator_delete(apuStack_68[0]);
    return;
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)psVar11,pcVar10,pcVar8);
  return;
}

Assistant:

void inc_term() {
        if (inc_term_cb_) {
            ulong new_term = inc_term_cb_(term_);
            assert(new_term > term_);
            term_ = new_term;
            return;
        }
        term_++;
    }